

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O3

void __thiscall wasm::anon_unknown_225::Inlining::run(Inlining *this,Module *module_)

{
  NameInfoMap *this_00;
  __node_base_ptr *pp_Var1;
  Index IVar2;
  uint uVar3;
  mapped_type mVar4;
  pointer puVar5;
  pointer puVar6;
  pointer puVar7;
  pointer puVar8;
  Global *pGVar9;
  pointer puVar10;
  pointer ppEVar11;
  pointer puVar12;
  DataSegment *pDVar13;
  Module *pMVar14;
  pointer puVar15;
  FunctionSplitter *pFVar16;
  pointer pIVar17;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>_>_>
  *p_Var18;
  Name name_00;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  char *pcVar22;
  bool bVar23;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>_>_>
  *this_01;
  pointer pNVar24;
  bool bVar25;
  mapped_type *pmVar26;
  FunctionSplitter *pFVar27;
  Function *func_00;
  size_type sVar28;
  mapped_type *pmVar29;
  mapped_type *pmVar30;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  Module *pMVar31;
  pointer puVar32;
  undefined1 auVar33 [8];
  long *plVar34;
  undefined8 *puVar35;
  ElementSegment *pEVar36;
  Module *pMVar37;
  Function *pFVar38;
  Function *pFVar39;
  _Hash_node_base _Var40;
  pointer ppEVar41;
  pointer action;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *curr;
  pointer puVar42;
  pointer puVar43;
  pointer puVar44;
  PassRunner *pPVar45;
  _Hash_node_base *p_Var46;
  iterator __begin2;
  ulong uVar47;
  Function *pFVar48;
  undefined1 local_2f0 [8];
  unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
  iterationCounts;
  undefined1 auStack_2a8 [8];
  unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
  inlinedUses;
  undefined1 auStack_188 [8];
  Name name;
  undefined1 local_170 [8];
  unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
  inlinedInto;
  InliningState state;
  Name inlinedName;
  Function *local_98;
  Function *func_2;
  iterator __end2;
  vector<wasm::Name,_std::allocator<wasm::Name>_> funcNames;
  undefined1 auStack_68 [8];
  vector<wasm::Name,_std::allocator<wasm::Name>_> splitNames;
  
  this->module = module_;
  puVar5 = (module_->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar6 = (module_->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_2f0 = (undefined1  [8])&iterationCounts._M_h._M_rehash_policy._M_next_resize;
  iterationCounts._M_h._M_buckets = (__buckets_ptr)&DAT_00000001;
  iterationCounts._M_h._M_bucket_count = 0;
  iterationCounts._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  iterationCounts._M_h._M_element_count._0_4_ = 0x3f800000;
  iterationCounts._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  iterationCounts._M_h._M_rehash_policy._4_4_ = 0;
  iterationCounts._M_h._M_rehash_policy._M_next_resize = 0;
  this_00 = &this->infos;
  uVar47 = 0;
  do {
    if ((ulong)((long)puVar5 - (long)puVar6 >> 3) < uVar47) break;
    local_170 = (undefined1  [8])&inlinedInto._M_h._M_rehash_policy._M_next_resize;
    inlinedInto._M_h._M_buckets = (__buckets_ptr)&DAT_00000001;
    inlinedInto._M_h._M_bucket_count = 0;
    inlinedInto._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    inlinedInto._M_h._M_element_count._0_4_ = 0x3f800000;
    inlinedInto._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    inlinedInto._M_h._M_rehash_policy._4_4_ = 0;
    inlinedInto._M_h._M_rehash_policy._M_next_resize = 0;
    std::
    _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::clear(&this_00->_M_h);
    pMVar37 = this->module;
    puVar32 = (pMVar37->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar7 = (pMVar37->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar32 != puVar7) {
      do {
        std::
        unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
        ::operator[](this_00,(key_type *)
                             (puVar32->_M_t).
                             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                             .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
        puVar32 = puVar32 + 1;
      } while (puVar32 != puVar7);
      pMVar37 = this->module;
    }
    inlinedUses._M_h._M_bucket_count = (size_type)&inlinedUses._M_h._M_element_count;
    inlinedUses._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    inlinedUses._M_h._M_element_count._0_4_ = (uint)inlinedUses._M_h._M_element_count & 0xffffff00;
    inlinedUses._M_h._M_rehash_policy._M_next_resize = 0;
    inlinedUses._M_h._M_single_bucket = (__node_base_ptr)0x0;
    auStack_2a8 = (undefined1  [8])&PTR__WalkerPass_00d73f30;
    inlinedUses._M_h._M_buckets = (__buckets_ptr)(this->super_Pass).runner;
    WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
    ::run((WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
           *)auStack_2a8,pMVar37);
    pMVar37 = this->module;
    puVar8 = (pMVar37->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar42 = (pMVar37->globals).
                   super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar42 != puVar8;
        puVar42 = puVar42 + 1) {
      pGVar9 = (puVar42->_M_t).
               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
               super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (*(char **)((long)&(pGVar9->super_Importable).module + 8) == (char *)0x0) {
        Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
        ::walk((Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
                *)&inlinedUses._M_h._M_rehash_policy._M_next_resize,&pGVar9->init);
      }
    }
    puVar10 = (pMVar37->elementSegments).
              super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar43 = (pMVar37->elementSegments).
                   super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar43 != puVar10;
        puVar43 = puVar43 + 1) {
      pEVar36 = (puVar43->_M_t).
                super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                ._M_t.
                super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
      if (pEVar36->offset != (Expression *)0x0) {
        Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
        ::walk((Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
                *)&inlinedUses._M_h._M_rehash_policy._M_next_resize,&pEVar36->offset);
        pEVar36 = (puVar43->_M_t).
                  super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                  .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
      }
      ppEVar11 = *(pointer *)
                  ((long)&(pEVar36->data).
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl + 8);
      for (ppEVar41 = (pEVar36->data).
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_start; ppEVar41 != ppEVar11;
          ppEVar41 = ppEVar41 + 1) {
        inlinedInto._M_h._M_single_bucket = (__node_base_ptr)*ppEVar41;
        Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
        ::walk((Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
                *)&inlinedUses._M_h._M_rehash_policy._M_next_resize,
               (Expression **)&inlinedInto._M_h._M_single_bucket);
      }
    }
    puVar12 = (pMVar37->dataSegments).
              super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar44 = (pMVar37->dataSegments).
                   super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar44 != puVar12;
        puVar44 = puVar44 + 1) {
      pDVar13 = (puVar44->_M_t).
                super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                _M_t.
                super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
      if (pDVar13->offset != (Expression *)0x0) {
        Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
        ::walk((Walker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>
                *)&inlinedUses._M_h._M_rehash_policy._M_next_resize,&pDVar13->offset);
      }
    }
    auStack_2a8 = (undefined1  [8])&PTR__Pass_00d722d8;
    if ((size_type *)inlinedUses._M_h._M_bucket_count != &inlinedUses._M_h._M_element_count) {
      operator_delete((void *)inlinedUses._M_h._M_bucket_count,
                      CONCAT44(inlinedUses._M_h._M_element_count._4_4_,
                               (uint)inlinedUses._M_h._M_element_count) + 1);
    }
    pMVar37 = this->module;
    pMVar31 = (Module *)
              (pMVar37->exports).
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pMVar14 = (Module *)
              (pMVar37->exports).
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pMVar31 != pMVar14) {
      do {
        puVar15 = (pMVar31->exports).
                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (*(int *)&puVar15[4]._M_t == 0) {
          pmVar26 = std::
                    unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                    ::operator[](this_00,(key_type *)(puVar15 + 2));
          pmVar26->usedGlobally = true;
        }
        pMVar31 = (Module *)
                  &(pMVar31->exports).
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      } while (pMVar31 != pMVar14);
      pMVar37 = this->module;
    }
    if ((pMVar37->start).super_IString.str._M_str != (char *)0x0) {
      pMVar37 = (Module *)&pMVar37->start;
      pmVar26 = std::
                unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                ::operator[](this_00,(key_type *)pMVar37);
      pmVar26->usedGlobally = true;
    }
    pPVar45 = (this->super_Pass).runner;
    if ((2 < (pPVar45->options).optimizeLevel) && ((pPVar45->options).shrinkLevel == 0)) {
      pMVar31 = this->module;
      pFVar27 = (FunctionSplitter *)operator_new(0x48);
      pFVar27->module = pMVar31;
      pFVar27->options = &pPVar45->options;
      (pFVar27->splits)._M_h._M_buckets = (__node_base_ptr *)((long)&(pFVar27->splits)._M_h + 0x30);
      *(size_type *)((long)&(pFVar27->splits)._M_h + 8) = 1;
      ((__node_base *)((long)&(pFVar27->splits)._M_h + 0x10))->_M_nxt = (_Hash_node_base *)0x0;
      *(size_type *)((long)&(pFVar27->splits)._M_h + 0x18) = 0;
      ((_Prime_rehash_policy *)((long)&(pFVar27->splits)._M_h + 0x20))->_M_max_load_factor = 1.0;
      *(size_t *)((long)&(pFVar27->splits)._M_h + 0x28) = 0;
      *(__node_base_ptr *)((long)&(pFVar27->splits)._M_h + 0x30) = (__node_base_ptr)0x0;
      pFVar16 = (this->functionSplitter)._M_t.
                super___uniq_ptr_impl<wasm::(anonymous_namespace)::FunctionSplitter,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                ._M_t.
                super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                .super__Head_base<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_false>.
                _M_head_impl;
      (this->functionSplitter)._M_t.
      super___uniq_ptr_impl<wasm::(anonymous_namespace)::FunctionSplitter,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
      ._M_t.
      super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
      .super__Head_base<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_false>._M_head_impl =
           pFVar27;
      if (pFVar16 != (FunctionSplitter *)0x0) {
        std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>::operator()
                  ((default_delete<wasm::(anonymous_namespace)::FunctionSplitter> *)pFVar16,
                   (FunctionSplitter *)pMVar37);
      }
    }
    inlinedInto._M_h._M_single_bucket =
         (__node_base_ptr)&state.worthInlining._M_h._M_rehash_policy._M_next_resize;
    state.worthInlining._M_h._M_buckets = (__buckets_ptr)&DAT_00000001;
    state.worthInlining._M_h._M_bucket_count = 0;
    state.worthInlining._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    pFVar38 = (Function *)&DAT_3f800000;
    state.worthInlining._M_h._M_element_count._0_4_ = 0x3f800000;
    state.worthInlining._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    state.worthInlining._M_h._M_rehash_policy._4_4_ = 0;
    state.worthInlining._M_h._M_rehash_policy._M_next_resize = 0;
    state.worthInlining._M_h._M_single_bucket =
         (__node_base_ptr)&state.actionsForFunction._M_h._M_rehash_policy._M_next_resize;
    state.actionsForFunction._M_h._M_buckets = (__buckets_ptr)&DAT_00000001;
    state.actionsForFunction._M_h._M_bucket_count = 0;
    state.actionsForFunction._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    state.actionsForFunction._M_h._M_element_count._0_4_ = 0x3f800000;
    state.actionsForFunction._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    state.actionsForFunction._M_h._M_rehash_policy._4_4_ = 0;
    state.actionsForFunction._M_h._M_rehash_policy._M_next_resize = 0;
    pFVar48 = (Function *)
              (this->module->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    func_2 = (Function *)
             (this->module->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    this_01 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>_>_>
               *)state.actionsForFunction._M_h._M_bucket_count;
    if (pFVar48 != func_2) {
      do {
        pFVar39 = (Function *)(pFVar48->super_Importable).super_Named.name.super_IString.str._M_len;
        if (*(char **)((long)&(pFVar39->super_Importable).module + 8) == (char *)0x0) {
          _Var40._M_nxt = *(_Hash_node_base **)&(pFVar39->super_Importable).super_Named;
          inlinedUses._M_h._M_buckets =
               *(__buckets_ptr *)
                &(((_Hash_node_value<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>
                    *)((long)&(pFVar39->super_Importable).super_Named + 8))->
                 super__Hash_node_value_base<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>
                 )._M_storage._M_storage;
          name_00.super_IString.str = *(IString *)&(pFVar39->super_Importable).super_Named;
          auStack_2a8 = (undefined1  [8])_Var40._M_nxt;
          pmVar26 = std::
                    unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                    ::operator[](this_00,(key_type *)auStack_2a8);
          pFVar38 = (Function *)&((this->super_Pass).runner)->options;
          bVar25 = FunctionInfo::worthInlining(pmVar26,(PassOptions *)pFVar38);
          if (bVar25) {
LAB_0073b72f:
            auStack_2a8 = (undefined1  [8])&inlinedInto._M_h._M_single_bucket;
            std::
            _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                      ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)auStack_2a8,pFVar39,auStack_2a8);
            pFVar38 = pFVar39;
          }
          else {
            pFVar16 = (this->functionSplitter)._M_t.
                      super___uniq_ptr_impl<wasm::(anonymous_namespace)::FunctionSplitter,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                      .super__Head_base<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_false>
                      ._M_head_impl;
            if (pFVar16 != (FunctionSplitter *)0x0) {
              func_00 = Module::getFunction(this->module,name_00);
              bVar25 = canHandleParams(func_00);
              pFVar38 = (Function *)_Var40._M_nxt;
              if ((bVar25) &&
                 (bVar25 = FunctionSplitter::maybeSplit(pFVar16,func_00,(Function **)0x0),
                 pFVar38 = func_00, bVar25)) goto LAB_0073b72f;
            }
          }
        }
        pFVar48 = (Function *)&(pFVar48->super_Importable).super_Named.name.super_IString.str._M_str
        ;
      } while (pFVar48 != func_2);
      this_01 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>_>_>
                 *)state.actionsForFunction._M_h._M_bucket_count;
      if (state.worthInlining._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
        __end2._M_current = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)0x0;
        funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        pMVar37 = this->module;
        puVar32 = (pMVar37->functions).
                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar7 = (pMVar37->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (puVar32 != puVar7) {
          do {
            std::
            unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
            ::operator[]((unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
                          *)&state.worthInlining._M_h._M_single_bucket,
                         (key_type *)
                         (puVar32->_M_t).
                         super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                         .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
            pFVar38 = (puVar32->_M_t).
                      super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                      .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
            if (funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start == (pointer)0x0) {
              std::vector<wasm::Name,std::allocator<wasm::Name>>::
              _M_realloc_insert<wasm::Name_const&>
                        ((vector<wasm::Name,std::allocator<wasm::Name>> *)&__end2,(iterator)0x0,
                         (Name *)pFVar38);
            }
            else {
              pcVar22 = *(char **)((long)&(pFVar38->super_Importable).super_Named + 8);
              ((funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start)->super_IString).str._M_len =
                   *(size_t *)&(pFVar38->super_Importable).super_Named;
              ((funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start)->super_IString).str._M_str = pcVar22;
              funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
              super__Vector_impl_data._M_start =
                   funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                   super__Vector_impl_data._M_start + 1;
            }
            puVar32 = puVar32 + 1;
          } while (puVar32 != puVar7);
          pMVar37 = this->module;
        }
        inlinedUses._M_h._M_bucket_count = (size_type)&inlinedUses._M_h._M_element_count;
        inlinedUses._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        inlinedUses._M_h._M_element_count._0_4_ =
             (uint)inlinedUses._M_h._M_element_count & 0xffffff00;
        inlinedUses._M_h._M_rehash_policy._M_next_resize = 0;
        inlinedUses._M_h._M_single_bucket = (__node_base_ptr)0x0;
        auStack_2a8 = (undefined1  [8])&PTR__WalkerPass_00d73f88;
        inlinedUses._M_h._M_buckets = (__buckets_ptr)(this->super_Pass).runner;
        WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>_>
        ::run((WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>_>
               *)auStack_2a8,pMVar37);
        auStack_2a8 = (undefined1  [8])&PTR__Pass_00d722d8;
        if ((size_type *)inlinedUses._M_h._M_bucket_count != &inlinedUses._M_h._M_element_count) {
          operator_delete((void *)inlinedUses._M_h._M_bucket_count,
                          CONCAT44(inlinedUses._M_h._M_element_count._4_4_,
                                   (uint)inlinedUses._M_h._M_element_count) + 1);
        }
        auStack_2a8 = (undefined1  [8])&inlinedUses._M_h._M_rehash_policy._M_next_resize;
        inlinedUses._M_h._M_buckets = (__buckets_ptr)&DAT_00000001;
        inlinedUses._M_h._M_bucket_count = 0;
        inlinedUses._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        inlinedUses._M_h._M_element_count._0_4_ = 0x3f800000;
        inlinedUses._M_h._M_rehash_policy._M_max_load_factor = 0.0;
        inlinedUses._M_h._M_rehash_policy._4_4_ = 0;
        inlinedUses._M_h._M_rehash_policy._M_next_resize = 0;
        pFVar38 = func_2;
        for (func_2 = (Function *)__end2._M_current;
            func_2 != (Function *)
                      funcNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                      super__Vector_impl_data._M_start;
            func_2 = (Function *)&(func_2->super_Importable).super_Named.hasExplicitName) {
          auStack_188 = (undefined1  [8])
                        (func_2->super_Importable).super_Named.name.super_IString.str._M_len;
          name.super_IString.str._M_len =
               (size_t)(func_2->super_Importable).super_Named.name.super_IString.str._M_str;
          local_98 = Module::getFunction(this->module,
                                         (Name)(func_2->super_Importable).super_Named.name.
                                               super_IString.str);
          sVar28 = std::
                   _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::count((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                            *)auStack_2a8,(key_type *)local_98);
          if (sVar28 == 0) {
            pmVar29 = std::
                      unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
                      ::operator[]((unordered_map<wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>_>
                                    *)&state.worthInlining._M_h._M_single_bucket,
                                   (key_type *)auStack_188);
            pIVar17 = (pmVar29->
                      super__Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
            for (action = (pmVar29->
                          super__Vector_base<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>
                          )._M_impl.super__Vector_impl_data._M_start; action != pIVar17;
                action = action + 1) {
              pFVar38 = action->contents;
              if (*(long **)((long)local_170 +
                            ((ulong)pFVar38 % (ulong)inlinedInto._M_h._M_buckets) * 8) !=
                  (long *)0x0) {
                plVar34 = (long *)**(long **)((long)local_170 +
                                             ((ulong)pFVar38 % (ulong)inlinedInto._M_h._M_buckets) *
                                             8);
                pFVar48 = (Function *)plVar34[1];
                do {
                  if (pFVar38 == pFVar48) goto LAB_0073bb47;
                  plVar34 = (long *)*plVar34;
                } while ((plVar34 != (long *)0x0) &&
                        (pFVar48 = (Function *)plVar34[1],
                        (ulong)pFVar48 % (ulong)inlinedInto._M_h._M_buckets ==
                        (ulong)pFVar38 % (ulong)inlinedInto._M_h._M_buckets));
              }
              iterationCounts._M_h._M_single_bucket =
                   (__node_base_ptr)
                   (pFVar38->super_Importable).super_Named.name.super_IString.str._M_len;
              auStack_68 = (undefined1  [8])
                           (local_98->super_Importable).super_Named.name.super_IString.str._M_len;
              splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)(local_98->super_Importable).super_Named.name.super_IString.str._M_str;
              state.actionsForFunction._M_h._M_single_bucket = iterationCounts._M_h._M_single_bucket
              ;
              pmVar26 = std::
                        unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                        ::operator[](this_00,(key_type *)auStack_68);
              IVar2 = pmVar26->size;
              pmVar26 = std::
                        unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                        ::operator[](this_00,(key_type *)&iterationCounts._M_h._M_single_bucket);
              if ((double)(IVar2 + pmVar26->size) * 2.5 < 409600.0) {
                auVar33 = (undefined1  [8])action->contents;
                pmVar26 = std::
                          unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                          ::operator[](this_00,(key_type *)auVar33);
                pPVar45 = (this->super_Pass).runner;
                bVar25 = FunctionInfo::worthInlining(pmVar26,&pPVar45->options);
                if (!bVar25) {
                  pFVar16 = (this->functionSplitter)._M_t.
                            super___uniq_ptr_impl<wasm::(anonymous_namespace)::FunctionSplitter,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                            .
                            super__Head_base<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_false>
                            ._M_head_impl;
                  if (pFVar16 == (FunctionSplitter *)0x0) {
                    __assert_fail("functionSplitter",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Inlining.cpp"
                                  ,0x460,
                                  "Function *wasm::(anonymous namespace)::Inlining::getActuallyInlinedFunction(Function *)"
                                 );
                  }
                  auStack_68 = (undefined1  [8])0x0;
                  bVar25 = FunctionSplitter::maybeSplit
                                     (pFVar16,(Function *)auVar33,(Function **)auStack_68);
                  if (!bVar25 || auStack_68 == (undefined1  [8])0x0) {
                    __assert_fail("success && inlineable",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Inlining.cpp"
                                  ,0x22f,
                                  "Function *wasm::(anonymous namespace)::FunctionSplitter::getInlineableSplitFunction(Function *)"
                                 );
                  }
                  pPVar45 = (this->super_Pass).runner;
                  auVar33 = auStack_68;
                }
                action->contents = (Function *)auVar33;
                doInlining(this->module,local_98,action,&pPVar45->options);
                pmVar30 = std::__detail::
                          _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        *)auStack_2a8,
                                       (key_type *)&state.actionsForFunction._M_h._M_single_bucket);
                *pmVar30 = *pmVar30 + 1;
                auStack_68 = (undefined1  [8])local_170;
                std::
                _Hashtable<wasm::Function*,wasm::Function*,std::allocator<wasm::Function*>,std::__detail::_Identity,std::equal_to<wasm::Function*>,std::hash<wasm::Function*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                ::
                _M_insert<wasm::Function*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Function*,false>>>>
                          ((_Hashtable<wasm::Function*,wasm::Function*,std::allocator<wasm::Function*>,std::__detail::_Identity,std::equal_to<wasm::Function*>,std::hash<wasm::Function*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                            *)auStack_68,&local_98,auStack_68);
                pmVar30 = std::__detail::
                          _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        *)auStack_2a8,
                                       (key_type *)&state.actionsForFunction._M_h._M_single_bucket);
                uVar3 = *pmVar30;
                pmVar26 = std::
                          unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                          ::operator[](this_00,(key_type *)
                                               &state.actionsForFunction._M_h._M_single_bucket);
                if ((pmVar26->refs).super___atomic_base<unsigned_int>._M_i < uVar3) {
                  __assert_fail("inlinedUses[inlinedName] <= infos[inlinedName].refs",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Inlining.cpp"
                                ,0x432,
                                "void wasm::(anonymous namespace)::Inlining::iteration(std::unordered_set<Function *> &)"
                               );
                }
              }
LAB_0073bb47:
            }
          }
          pFVar38 = func_2;
        }
        func_2 = pFVar38;
        if ((this->optimize == true) &&
           (inlinedInto._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0)) {
          OptUtils::optimizeAfterInlining
                    ((unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                      *)local_170,this->module,(this->super_Pass).runner);
        }
        splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)auStack_2a8;
        splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)std::
                      _Function_handler<bool_(wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Inlining.cpp:1081:29)>
                      ::_M_invoke;
        splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)std::
                      _Function_handler<bool_(wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Inlining.cpp:1081:29)>
                      ::_M_manager;
        pFVar38 = (Function *)auStack_68;
        auStack_68 = (undefined1  [8])this;
        Module::removeFunctions(this->module,(function<bool_(wasm::Function_*)> *)pFVar38);
        if (splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_finish != (pointer)0x0) {
          pFVar38 = (Function *)auStack_68;
          (*(code *)splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                    super__Vector_impl_data._M_finish)(pFVar38,pFVar38,3);
        }
        std::
        _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)auStack_2a8);
        this_01 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>_>_>
                   *)state.actionsForFunction._M_h._M_bucket_count;
        if (__end2._M_current !=
            (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)0x0) {
          pFVar38 = (Function *)-(long)__end2._M_current;
          operator_delete(__end2._M_current,(ulong)pFVar38);
          this_01 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>_>_>
                     *)state.actionsForFunction._M_h._M_bucket_count;
        }
      }
    }
    while (this_01 !=
           (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>_>_>
            *)0x0) {
      p_Var18 = *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>_>_>
                  **)this_01;
      std::__detail::
      _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>_>_>
      ::_M_deallocate_node(this_01,(__node_ptr)pFVar38);
      this_01 = p_Var18;
    }
    memset(state.worthInlining._M_h._M_single_bucket,0,
           (long)state.actionsForFunction._M_h._M_buckets << 3);
    state.actionsForFunction._M_h._M_bucket_count = 0;
    state.actionsForFunction._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    if ((__node_base_ptr)&state.actionsForFunction._M_h._M_rehash_policy._M_next_resize !=
        state.worthInlining._M_h._M_single_bucket) {
      operator_delete(state.worthInlining._M_h._M_single_bucket,
                      (long)state.actionsForFunction._M_h._M_buckets << 3);
    }
    std::
    _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&inlinedInto._M_h._M_single_bucket);
    if (inlinedInto._M_h._M_before_begin._M_nxt == (_Hash_node_base *)0x0) {
LAB_0073be60:
      std::
      _Hashtable<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)local_170);
      break;
    }
    plVar34 = (long *)inlinedInto._M_h._M_bucket_count;
    if (inlinedInto._M_h._M_bucket_count != 0) {
      do {
        EHUtils::handleBlockNestedPops((Function *)plVar34[1],this->module);
        plVar34 = (long *)*plVar34;
        puVar35 = (undefined8 *)inlinedInto._M_h._M_bucket_count;
      } while (plVar34 != (long *)0x0);
      for (; puVar35 != (undefined8 *)0x0; puVar35 = (undefined8 *)*puVar35) {
        pmVar30 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_2f0,(key_type *)puVar35[1]);
        mVar4 = *pmVar30;
        *pmVar30 = mVar4 + 1;
        if (4 < mVar4 + 1) goto LAB_0073be60;
      }
    }
    pFVar16 = (this->functionSplitter)._M_t.
              super___uniq_ptr_impl<wasm::(anonymous_namespace)::FunctionSplitter,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
              .super__Head_base<0UL,_wasm::(anonymous_namespace)::FunctionSplitter_*,_false>.
              _M_head_impl;
    if (pFVar16 == (FunctionSplitter *)0x0) {
LAB_0073be3e:
      bVar23 = false;
    }
    else {
      auStack_68 = (undefined1  [8])0x0;
      splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      auStack_2a8 = (undefined1  [8])&inlinedUses._M_h._M_rehash_policy._M_next_resize;
      inlinedUses._M_h._M_buckets = (__buckets_ptr)&DAT_00000001;
      inlinedUses._M_h._M_bucket_count = 0;
      inlinedUses._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      inlinedUses._M_h._M_element_count._0_4_ = 0x3f800000;
      inlinedUses._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      inlinedUses._M_h._M_rehash_policy._4_4_ = 0;
      inlinedUses._M_h._M_rehash_policy._M_next_resize = 0;
      for (p_Var46 = ((__node_base *)((long)&(pFVar16->splits)._M_h + 0x10))->_M_nxt;
          p_Var46 != (_Hash_node_base *)0x0; p_Var46 = p_Var46->_M_nxt) {
        if (p_Var46[4]._M_nxt != (_Hash_node_base *)0x0) {
          inlinedInto._M_h._M_single_bucket = (__node_base_ptr)auStack_2a8;
          std::
          _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                    ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)inlinedInto._M_h._M_single_bucket,p_Var46[4]._M_nxt,
                     &inlinedInto._M_h._M_single_bucket);
          if (splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
              super__Vector_impl_data._M_start ==
              splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
                      ((vector<wasm::Name,std::allocator<wasm::Name>> *)auStack_68,
                       (iterator)
                       splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                       _M_impl.super__Vector_impl_data._M_start,(Name *)(p_Var46 + 1));
          }
          else {
            uVar19 = *(undefined4 *)((long)&p_Var46[1]._M_nxt + 4);
            uVar20 = *(undefined4 *)&p_Var46[2]._M_nxt;
            uVar21 = *(undefined4 *)((long)&p_Var46[2]._M_nxt + 4);
            *(int *)&((splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                       _M_impl.super__Vector_impl_data._M_start)->super_IString).str._M_len =
                 (int)(((Name *)(p_Var46 + 1))->super_IString).str._M_len;
            *(undefined4 *)
             ((long)&((splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                       _M_impl.super__Vector_impl_data._M_start)->super_IString).str._M_len + 4) =
                 uVar19;
            *(undefined4 *)
             &((splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start)->super_IString).str._M_str = uVar20;
            *(undefined4 *)
             ((long)&((splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                       _M_impl.super__Vector_impl_data._M_start)->super_IString).str._M_str + 4) =
                 uVar21;
            splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start =
                 splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                 super__Vector_impl_data._M_start + 1;
          }
        }
      }
      state.worthInlining._M_h._M_buckets = (__buckets_ptr)0x0;
      inlinedInto._M_h._M_single_bucket = (__node_base_ptr)auStack_2a8;
      state.worthInlining._M_h._M_before_begin._M_nxt =
           (_Hash_node_base *)
           std::
           _Function_handler<bool_(wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Inlining.cpp:578:29)>
           ::_M_invoke;
      state.worthInlining._M_h._M_bucket_count =
           (size_type)
           std::
           _Function_handler<bool_(wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Inlining.cpp:578:29)>
           ::_M_manager;
      Module::removeFunctions
                (pFVar16->module,
                 (function<bool_(wasm::Function_*)> *)&inlinedInto._M_h._M_single_bucket);
      if (state.worthInlining._M_h._M_bucket_count != 0) {
        pp_Var1 = &inlinedInto._M_h._M_single_bucket;
        (*(code *)state.worthInlining._M_h._M_bucket_count)(pp_Var1,pp_Var1,3);
      }
      std::
      _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)auStack_2a8);
      pNVar24 = splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start;
      auVar33 = auStack_68;
      if (auStack_68 ==
          (undefined1  [8])
          splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_start) {
        bVar23 = false;
        bVar25 = true;
      }
      else {
        do {
          auStack_2a8 = (undefined1  [8])
                        (((Function *)auVar33)->super_Importable).super_Named.name.super_IString.str
                        ._M_len;
          inlinedUses._M_h._M_buckets =
               (__buckets_ptr)
               (((Function *)auVar33)->super_Importable).super_Named.name.super_IString.str._M_str;
          pmVar30 = std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)local_2f0,(key_type *)auStack_2a8);
          mVar4 = *pmVar30;
          *pmVar30 = mVar4 + 1;
          bVar25 = mVar4 + 1 < 5;
          if (!bVar25) {
            bVar23 = true;
            goto LAB_0073be21;
          }
          auVar33 = (undefined1  [8])
                    &(((Function *)auVar33)->super_Importable).super_Named.hasExplicitName;
        } while (auVar33 != (undefined1  [8])pNVar24);
        bVar23 = false;
      }
LAB_0073be21:
      if (auStack_68 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_68,
                        (long)splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_68);
      }
      if (bVar25) goto LAB_0073be3e;
    }
    uVar47 = (ulong)((int)uVar47 + 1);
    std::
    _Hashtable<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_170);
  } while (!bVar23);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_2f0);
  return;
}

Assistant:

void run(Module* module_) override {
    module = module_;

    // No point to do more iterations than the number of functions, as it means
    // we are infinitely recursing (which should be very rare in practice, but
    // it is possible that a recursive call can look like it is worth inlining).
    Index iterationNumber = 0;

    auto numOriginalFunctions = module->functions.size();

    // Track in how many iterations a function was inlined into. We are willing
    // to inline many times into a function within an iteration, as e.g. that
    // helps the case of many calls of a small getter. However, if we only do
    // more inlining in separate iterations then it is likely code that was the
    // result of previous inlinings that is now being inlined into. That is, an
    // old inlining added a call to somewhere, and now we are inlining into that
    // call. This is typically recursion, which to some extent can help, but
    // then like loop unrolling it loses its benefit quickly, so set a limit
    // here.
    //
    // In addition to inlining into a function, we track how many times we do
    // other potentially repetitive operations like splitting a function before
    // inlining, as any such repetitive operation should be limited in how many
    // times we perform it. (An exception is how many times we inlined a
    // function, which we do not want to limit - it can be profitable to inline
    // a call into a great many callsites, over many iterations.)
    //
    // (Track names here, and not Function pointers, as we can remove functions
    // while inlining, and it may be confusing during debugging to have a
    // pointer to something that was removed.)
    std::unordered_map<Name, Index> iterationCounts;

    const size_t MaxIterationsForFunc = 5;

    while (iterationNumber <= numOriginalFunctions) {
#ifdef INLINING_DEBUG
      std::cout << "inlining loop iter " << iterationNumber
                << " (numFunctions: " << module->functions.size() << ")\n";
#endif
      iterationNumber++;

      std::unordered_set<Function*> inlinedInto;

      prepare();
      iteration(inlinedInto);

      if (inlinedInto.empty()) {
        return;
      }

#ifdef INLINING_DEBUG
      std::cout << "  inlined into " << inlinedInto.size() << " funcs.\n";
#endif

      for (auto* func : inlinedInto) {
        EHUtils::handleBlockNestedPops(func, *module);
      }

      for (auto* func : inlinedInto) {
        if (++iterationCounts[func->name] >= MaxIterationsForFunc) {
          return;
        }
      }

      if (functionSplitter) {
        auto splitNames = functionSplitter->finish();
        for (auto name : splitNames) {
          if (++iterationCounts[name] >= MaxIterationsForFunc) {
            return;
          }
        }
      }
    }
  }